

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

void __thiscall
fasttext::Loss::findKBest(Loss *this,int32_t k,real threshold,Predictions *heap,Vector *output)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  int64_t iVar1;
  real *prVar2;
  size_type sVar3;
  reference pvVar4;
  pair<float,_int> pVar5;
  iterator iVar6;
  iterator __first_00;
  iterator __comp;
  value_type *in_RDX;
  int in_ESI;
  float in_XMM0_Da;
  real rVar7;
  int32_t i;
  value_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  real in_stack_ffffffffffffffa4;
  float fVar8;
  int local_24;
  
  local_24 = 0;
  do {
    iVar1 = Vector::size((Vector *)0x1c19a9);
    if (iVar1 <= local_24) {
      return;
    }
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (int64_t)in_stack_ffffffffffffff98);
    if (in_XMM0_Da <= *prVar2) {
      sVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_RDX);
      if (sVar3 == (long)in_ESI) {
        Vector::operator[]((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (int64_t)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa4 = std_log(0.0);
        pvVar4 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                           ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        if (in_stack_ffffffffffffffa4 < pvVar4->first) goto LAB_001c1b00;
      }
      in_stack_ffffffffffffff98 = in_RDX;
      Vector::operator[]((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int64_t)in_RDX);
      rVar7 = std_log(0.0);
      pVar5 = std::make_pair<float,int&>(&in_stack_ffffffffffffff98->first,(int *)0x1c1a65);
      fVar8 = pVar5.first;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::push_back
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      iVar6 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_stack_ffffffffffffff98);
      __first_00 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                             ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                               *)in_stack_ffffffffffffff98);
      __first._M_current._4_4_ = fVar8;
      __first._M_current._0_4_ = rVar7;
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                (__first,(__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          )iVar6._M_current,
                 (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)__first_00._M_current);
      sVar3 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         in_RDX);
      if ((ulong)(long)in_ESI < sVar3) {
        iVar6 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                          ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *
                           )in_stack_ffffffffffffff98);
        __comp = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                           ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             *)in_stack_ffffffffffffff98);
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )__first_00._M_current,
                   (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                    )iVar6._M_current,
                   (_func_bool_pair<float,_int>_ptr_pair<float,_int>_ptr *)__comp._M_current);
        std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::pop_back
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   0x1c1afe);
      }
    }
LAB_001c1b00:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Loss::findKBest(
    int32_t k,
    real threshold,
    Predictions& heap,
    const Vector& output) const {
  for (int32_t i = 0; i < output.size(); i++) {
    if (output[i] < threshold) {
      continue;
    }
    if (heap.size() == k && std_log(output[i]) < heap.front().first) {
      continue;
    }
    heap.push_back(std::make_pair(std_log(output[i]), i));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
  }
}